

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset.cpp
# Opt level: O0

USet * uset_open_63(UChar32 start,UChar32 end)

{
  UnicodeSet *this;
  undefined4 in_register_00000034;
  undefined8 local_30;
  UChar32 end_local;
  UChar32 start_local;
  
  this = (UnicodeSet *)
         icu_63::UMemory::operator_new((UMemory *)0x58,CONCAT44(in_register_00000034,end));
  local_30 = (UnicodeSet *)0x0;
  if (this != (UnicodeSet *)0x0) {
    icu_63::UnicodeSet::UnicodeSet(this,start,end);
    local_30 = this;
  }
  return (USet *)local_30;
}

Assistant:

U_CAPI USet* U_EXPORT2
uset_open(UChar32 start, UChar32 end) {
    return (USet*) new UnicodeSet(start, end);
}